

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

void check_refer_picture_lists(H264_SLICE_t *currSlice)

{
  int iVar1;
  H264_DecCtx_t *p_Dec_00;
  RK_U32 RVar2;
  uint uVar3;
  RK_U32 local_40;
  RK_U32 local_3c;
  RK_S32 active_l1;
  RK_S32 over_flag_1;
  RK_S32 pps_refs_1;
  RK_S32 active_l0;
  RK_S32 over_flag;
  RK_S32 pps_refs;
  H264dErrCtx_t *p_err;
  H264_DecCtx_t *p_Dec;
  H264_SLICE_t *currSlice_local;
  
  p_Dec_00 = currSlice->p_Dec;
  if (currSlice->slice_type == 2) {
    (p_Dec_00->errctx).dpb_err_flag = 0;
  }
  else {
    if ((currSlice->slice_type % 5 != 2) && (currSlice->slice_type % 5 != 4)) {
      if (currSlice->ref_pic_list_reordering_flag[0] == 0) {
        uVar3 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
        iVar1 = currSlice->num_ref_idx_override_flag;
        local_3c = uVar3;
        if (iVar1 != 0) {
          local_3c = currSlice->num_ref_idx_active[0];
        }
        if (currSlice->slice_type % 5 == 1) {
          RVar2 = check_ref_dbp_err(p_Dec_00,p_Dec_00->refpic_info_b[0],local_3c);
          (p_Dec_00->errctx).cur_err_flag = (uint)(RVar2 != 0) | (p_Dec_00->errctx).cur_err_flag;
        }
        else {
          RVar2 = check_ref_dbp_err(p_Dec_00,p_Dec_00->refpic_info_p,local_3c);
          (p_Dec_00->errctx).cur_err_flag = (uint)(RVar2 != 0) | (p_Dec_00->errctx).cur_err_flag;
        }
        if ((h264d_debug & 0x1000) != 0) {
          _mpp_log_l(4,"h264d_init",
                     "list0 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l0=%d\n",
                     (char *)0x0,(ulong)(p_Dec_00->errctx).cur_err_flag,(ulong)uVar3,iVar1,local_3c)
          ;
        }
      }
      else {
        RVar2 = check_ref_pic_list(currSlice,0);
        (p_Dec_00->errctx).cur_err_flag = (uint)(RVar2 != 0) | (p_Dec_00->errctx).cur_err_flag;
      }
    }
    if (currSlice->slice_type % 5 == 1) {
      if (currSlice->ref_pic_list_reordering_flag[1] == 0) {
        uVar3 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
        iVar1 = currSlice->num_ref_idx_override_flag;
        local_40 = uVar3;
        if (iVar1 != 0) {
          local_40 = currSlice->num_ref_idx_active[1];
        }
        RVar2 = check_ref_dbp_err(p_Dec_00,p_Dec_00->refpic_info_b[1],local_40);
        (p_Dec_00->errctx).cur_err_flag = (uint)(RVar2 != 0) | (p_Dec_00->errctx).cur_err_flag;
        if ((h264d_debug & 0x1000) != 0) {
          _mpp_log_l(4,"h264d_init",
                     "list1 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l1=%d\n",
                     (char *)0x0,(ulong)(p_Dec_00->errctx).cur_err_flag,(ulong)uVar3,iVar1,local_40)
          ;
        }
      }
      else {
        RVar2 = check_ref_pic_list(currSlice,1);
        (p_Dec_00->errctx).cur_err_flag = (uint)(RVar2 != 0) | (p_Dec_00->errctx).cur_err_flag;
      }
    }
  }
  return;
}

Assistant:

static void check_refer_picture_lists(H264_SLICE_t *currSlice)
{
    H264_DecCtx_t *p_Dec = currSlice->p_Dec;
    H264dErrCtx_t *p_err = &p_Dec->errctx;

    if (H264_I_SLICE == currSlice->slice_type) {
        p_err->dpb_err_flag = 0;
        return;
    }
#if 1

    if ((currSlice->slice_type % 5) != H264_I_SLICE
        && (currSlice->slice_type % 5) != H264_SI_SLICE) {
        if (currSlice->ref_pic_list_reordering_flag[LIST_0]) {
            p_err->cur_err_flag |= check_ref_pic_list(currSlice, 0) ? 1 : 0;
        } else {
            RK_S32 pps_refs = currSlice->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
            RK_S32 over_flag = currSlice->num_ref_idx_override_flag;
            RK_S32 active_l0 = over_flag ? currSlice->num_ref_idx_active[LIST_0] : pps_refs;
            if (currSlice->slice_type % 5 == H264_B_SLICE)
                p_err->cur_err_flag |= check_ref_dbp_err(p_Dec, p_Dec->refpic_info_b[0], active_l0) ? 1 : 0;
            else
                p_err->cur_err_flag |= check_ref_dbp_err(p_Dec, p_Dec->refpic_info_p, active_l0) ? 1 : 0;
            H264D_DBG(H264D_DBG_DPB_REF_ERR, "list0 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l0=%d\n",
                      p_err->cur_err_flag, pps_refs, over_flag, active_l0);
        }
    }
    if (currSlice->slice_type % 5 == H264_B_SLICE) {
        if (currSlice->ref_pic_list_reordering_flag[LIST_1]) {
            p_err->cur_err_flag |= check_ref_pic_list(currSlice, 1) ? 1 : 0;
        } else {
            RK_S32 pps_refs = currSlice->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
            RK_S32 over_flag = currSlice->num_ref_idx_override_flag;
            RK_S32 active_l1 = over_flag ? currSlice->num_ref_idx_active[LIST_1] : pps_refs;
            p_err->cur_err_flag |= check_ref_dbp_err(p_Dec, p_Dec->refpic_info_b[1], active_l1) ? 1 : 0;
            H264D_DBG(H264D_DBG_DPB_REF_ERR, "list1 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l1=%d\n",
                      p_err->cur_err_flag, pps_refs, over_flag, active_l1);
        }
    }

#endif

}